

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O0

MPP_RET mpi_enc_test_cmd_put(MpiEncTestArgs *cmd)

{
  MpiEncTestArgs *cmd_local;
  
  if (cmd != (MpiEncTestArgs *)0x0) {
    if (cmd->cfg_ini != (dictionary *)0x0) {
      iniparser_freedict(cmd->cfg_ini);
      cmd->cfg_ini = (dictionary *)0x0;
    }
    if (cmd->fps != (FpsCalc)0x0) {
      fps_calc_deinit(cmd->fps);
      cmd->fps = (FpsCalc)0x0;
    }
    if (cmd->file_input != (char *)0x0) {
      mpp_osal_free("mpi_enc_test_cmd_put",cmd->file_input);
    }
    cmd->file_input = (char *)0x0;
    if (cmd->file_output != (char *)0x0) {
      mpp_osal_free("mpi_enc_test_cmd_put",cmd->file_output);
    }
    cmd->file_output = (char *)0x0;
    if (cmd->file_cfg != (char *)0x0) {
      mpp_osal_free("mpi_enc_test_cmd_put",cmd->file_cfg);
    }
    cmd->file_cfg = (char *)0x0;
    if (cmd->file_slt != (char *)0x0) {
      mpp_osal_free("mpi_enc_test_cmd_put",cmd->file_slt);
    }
    cmd->file_slt = (char *)0x0;
    if (cmd != (MpiEncTestArgs *)0x0) {
      mpp_osal_free("mpi_enc_test_cmd_put",cmd);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpi_enc_test_cmd_put(MpiEncTestArgs* cmd)
{
    if (NULL == cmd)
        return MPP_OK;

    if (cmd->cfg_ini) {
        iniparser_freedict(cmd->cfg_ini);
        cmd->cfg_ini = NULL;
    }

    if (cmd->fps) {
        fps_calc_deinit(cmd->fps);
        cmd->fps = NULL;
    }

    MPP_FREE(cmd->file_input);
    MPP_FREE(cmd->file_output);
    MPP_FREE(cmd->file_cfg);
    MPP_FREE(cmd->file_slt);
    MPP_FREE(cmd);

    return MPP_OK;
}